

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Thing_SetSpecial(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                       int arg4)

{
  AActor *pAVar1;
  FActorIterator iterator;
  
  if (arg0 == 0) {
    if (it != (AActor *)0x0) {
      it->special = arg1;
      it->args[0] = arg2;
      it->args[1] = arg3;
      it->args[2] = arg4;
    }
  }
  else {
    iterator.base = (AActor *)0x0;
    iterator.id = arg0;
    while( true ) {
      pAVar1 = FActorIterator::Next(&iterator);
      if (pAVar1 == (AActor *)0x0) break;
      pAVar1->special = arg1;
      pAVar1->args[0] = arg2;
      pAVar1->args[1] = arg3;
      pAVar1->args[2] = arg4;
    }
  }
  return 1;
}

Assistant:

FUNC(LS_Thing_SetSpecial)	// [BC]
// Thing_SetSpecial (tid, special, arg1, arg2, arg3)
// [RH] Use the SetThingSpecial ACS command instead.
// It can set all args and not just the first three.
{
	if (arg0 == 0)
	{
		if (it != NULL)
		{
			it->special = arg1;
			it->args[0] = arg2;
			it->args[1] = arg3;
			it->args[2] = arg4;
		}
	}
	else
	{
		AActor *actor;
		FActorIterator iterator (arg0);

		while ( (actor = iterator.Next ()) )
		{
			actor->special = arg1;
			actor->args[0] = arg2;
			actor->args[1] = arg3;
			actor->args[2] = arg4;
		}
	}
	return true;
}